

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_ciphersuite(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t __n;
  size_t dec2len;
  size_t dec1len;
  size_t enc2len;
  size_t enc1len;
  char dec2 [256];
  char dec1 [256];
  char enc2 [256];
  char enc1 [256];
  ptls_aead_context_t *c;
  char *src2;
  char *src1;
  char *traffic_secret;
  ptls_cipher_suite_t *cs2_local;
  ptls_cipher_suite_t *cs1_local;
  
  ppVar2 = ptls_aead_new(cs1->aead,cs1->hash,1,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0x8b,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
  }
  ptls_aead_encrypt_init(ppVar2,0,(void *)0x0,0);
  sVar3 = strlen("hello world");
  sVar4 = ptls_aead_encrypt_update(ppVar2,enc2 + 0xf8,"hello world",sVar3);
  sVar5 = ptls_aead_encrypt_final(ppVar2,enc2 + sVar4 + 0xf8);
  ptls_aead_encrypt_init(ppVar2,1,(void *)0x0,0);
  sVar3 = strlen("good bye, all");
  sVar6 = ptls_aead_encrypt_update(ppVar2,dec1 + 0xf8,"good bye, all",sVar3);
  sVar7 = ptls_aead_encrypt_final(ppVar2,dec1 + sVar6 + 0xf8);
  ptls_aead_free(ppVar2);
  ppVar2 = ptls_aead_new(cs2->aead,cs2->hash,0,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    __n = ptls_aead_decrypt(ppVar2,dec2 + 0xf8,enc2 + 0xf8,sVar5 + sVar4,0,(void *)0x0,0);
    _ok((uint)(__n != 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x99);
    sVar6 = ptls_aead_decrypt(ppVar2,&enc1len,dec1 + 0xf8,sVar7 + sVar6,1,(void *)0x0,0);
    _ok((uint)(sVar6 != 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9b);
    sVar3 = strlen("hello world");
    _ok((uint)(sVar3 == __n),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9c);
    iVar1 = memcmp("hello world",dec2 + 0xf8,__n);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9d);
    sVar3 = strlen("good bye, all");
    _ok((uint)(sVar3 == sVar6),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9e);
    iVar1 = memcmp("good bye, all",&enc1len,sVar6 - 1);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x9f);
    enc2[0xf8] = enc2[0xf8] ^ 1;
    sVar4 = ptls_aead_decrypt(ppVar2,dec2 + 0xf8,enc2 + 0xf8,sVar5 + sVar4,0,(void *)0x0,0);
    _ok((uint)(sVar4 == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xa4);
    ptls_aead_free(ppVar2);
    return;
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0x95,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_ciphersuite(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567", *src1 = "hello world", *src2 = "good bye, all";
    ptls_aead_context_t *c;
    char enc1[256], enc2[256], dec1[256], dec2[256];
    size_t enc1len, enc2len, dec1len, dec2len;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    ptls_aead_encrypt_init(c, 0, NULL, 0);
    enc1len = ptls_aead_encrypt_update(c, enc1, src1, strlen(src1));
    enc1len += ptls_aead_encrypt_final(c, enc1 + enc1len);
    ptls_aead_encrypt_init(c, 1, NULL, 0);
    enc2len = ptls_aead_encrypt_update(c, enc2, src2, strlen(src2));
    enc2len += ptls_aead_encrypt_final(c, enc2 + enc2len);
    ptls_aead_free(c);

    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    assert(c != NULL);

    /* decrypt and compare */
    dec1len = ptls_aead_decrypt(c, dec1, enc1, enc1len, 0, NULL, 0);
    ok(dec1len != SIZE_MAX);
    dec2len = ptls_aead_decrypt(c, dec2, enc2, enc2len, 1, NULL, 0);
    ok(dec2len != SIZE_MAX);
    ok(strlen(src1) == dec1len);
    ok(memcmp(src1, dec1, dec1len) == 0);
    ok(strlen(src2) == dec2len);
    ok(memcmp(src2, dec2, dec2len - 1) == 0);

    /* alter and decrypt to detect failure */
    enc1[0] ^= 1;
    dec1len = ptls_aead_decrypt(c, dec1, enc1, enc1len, 0, NULL, 0);
    ok(dec1len == SIZE_MAX);

    ptls_aead_free(c);
}